

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O3

LY_ERR lysp_check_prefix(lysp_ctx *ctx,lysp_import *imports,char *module_prefix,char **value)

{
  char *pcVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  char **ppcVar5;
  ly_ctx *plVar6;
  ulong uVar7;
  
  if (module_prefix != (char *)0x0) {
    pcVar1 = *value;
    iVar3 = strcmp(module_prefix,pcVar1);
    if (iVar3 == 0) {
      if (ctx == (lysp_ctx *)0x0) {
        plVar6 = (ly_ctx *)0x0;
      }
      else {
        plVar6 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_vlog(plVar6,(char *)0x0,LYVE_REFERENCE,"Prefix \"%s\" already used as module prefix.",
              pcVar1);
      return LY_EEXIST;
    }
  }
  if ((imports != (lysp_import *)0x0) && (uVar2 = *(ulong *)(imports[-1].rev + 6), uVar2 != 0)) {
    ppcVar5 = &imports->prefix;
    uVar7 = 0x40;
    do {
      if (ppcVar5 != value && *ppcVar5 != (char *)0x0) {
        pcVar1 = *value;
        iVar3 = strcmp(*ppcVar5,pcVar1);
        if (iVar3 == 0) {
          if (ctx == (lysp_ctx *)0x0) {
            plVar6 = (ly_ctx *)0x0;
          }
          else {
            plVar6 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          ly_vlog(plVar6,(char *)0x0,LYVE_REFERENCE,
                  "Prefix \"%s\" already used to import \"%s\" module.",pcVar1,ppcVar5[-1]);
          return LY_EEXIST;
        }
      }
      uVar4 = uVar7 >> 6;
      ppcVar5 = ppcVar5 + 8;
      uVar7 = uVar7 + 0x40;
    } while (uVar4 < uVar2);
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lysp_check_prefix(struct lysp_ctx *ctx, struct lysp_import *imports, const char *module_prefix, const char **value)
{
    struct lysp_import *i;

    if (module_prefix && (&module_prefix != value) && !strcmp(module_prefix, *value)) {
        LOGVAL_PARSER(ctx, LYVE_REFERENCE, "Prefix \"%s\" already used as module prefix.", *value);
        return LY_EEXIST;
    }
    LY_ARRAY_FOR(imports, struct lysp_import, i) {
        if (i->prefix && (&i->prefix != value) && !strcmp(i->prefix, *value)) {
            LOGVAL_PARSER(ctx, LYVE_REFERENCE, "Prefix \"%s\" already used to import \"%s\" module.", *value, i->name);
            return LY_EEXIST;
        }
    }
    return LY_SUCCESS;
}